

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS
ref_cavity_form_insert
          (REF_CAVITY ref_cavity,REF_GRID ref_grid,REF_INT node,REF_INT site,REF_INT protect,
          REF_INT faceid)

{
  REF_NODE ref_node_00;
  REF_CELL pRVar1;
  bool bVar2;
  uint uVar3;
  bool bVar4;
  REF_INT local_d8;
  REF_INT local_d0;
  int local_cc;
  REF_INT local_c8;
  REF_INT local_c0;
  int local_bc;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_BOOL protected_cell_1;
  REF_INT cell_node_1;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_BOOL protected_cell;
  REF_INT cell_node;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT seg_nodes [3];
  REF_INT face_nodes [3];
  REF_BOOL all_local;
  REF_BOOL already_have_it;
  REF_BOOL has_node;
  REF_INT cell;
  REF_INT face_node;
  REF_INT cell_face;
  REF_INT item;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  REF_INT faceid_local;
  REF_INT protect_local;
  REF_INT site_local;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  REF_CAVITY ref_cavity_local;
  
  ref_node_00 = ref_grid->node;
  ref_cavity_local._4_4_ = ref_cavity_form_empty(ref_cavity,ref_grid,node);
  if (ref_cavity_local._4_4_ == 0) {
    if ((ref_node_00->ref_mpi->id == ref_node_00->part[node]) &&
       (ref_node_00->ref_mpi->id == ref_node_00->part[site])) {
      if ((ref_grid->cell[9]->n < 1) && (ref_grid->cell[10]->n < 1)) {
        pRVar1 = ref_grid->cell[3];
        if ((site < 0) || (pRVar1->ref_adj->nnode <= site)) {
          local_bc = -1;
        }
        else {
          local_bc = pRVar1->ref_adj->first[site];
        }
        face_node = local_bc;
        if (local_bc == -1) {
          local_c0 = -1;
        }
        else {
          local_c0 = pRVar1->ref_adj->item[local_bc].ref;
        }
        already_have_it = local_c0;
        while (face_node != -1) {
          bVar4 = false;
          for (ref_private_macro_code_rss_1 = 0; ref_private_macro_code_rss_1 < pRVar1->node_per;
              ref_private_macro_code_rss_1 = ref_private_macro_code_rss_1 + 1) {
            bVar2 = !bVar4;
            bVar4 = true;
            if (bVar2) {
              bVar4 = protect ==
                      pRVar1->c2n[ref_private_macro_code_rss_1 + pRVar1->size_per * already_have_it]
              ;
            }
          }
          if ((!bVar4) &&
             ((faceid == -1 ||
              (faceid == pRVar1->c2n[pRVar1->node_per + pRVar1->size_per * already_have_it])))) {
            uVar3 = ref_list_contains(ref_cavity->tri_list,already_have_it,face_nodes + 2);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x39d,"ref_cavity_form_insert",(ulong)uVar3,"have tet?");
              return uVar3;
            }
            if (face_nodes[2] != 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x39e,"ref_cavity_form_insert","added tri twice?");
              return 1;
            }
            uVar3 = ref_list_push(ref_cavity->tri_list,already_have_it);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x39f,"ref_cavity_form_insert",(ulong)uVar3,"save tri");
              return uVar3;
            }
            uVar3 = ref_cell_all_local(pRVar1,ref_node_00,already_have_it,face_nodes + 1);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x3a0,"ref_cavity_form_insert",(ulong)uVar3,"local cell");
              return uVar3;
            }
            if (face_nodes[1] == 0) {
              ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
              return 0;
            }
            seg_nodes[0] = pRVar1->c2n[pRVar1->node_per + pRVar1->size_per * already_have_it];
            cell_node = pRVar1->c2n[pRVar1->size_per * already_have_it + 1];
            ref_private_macro_code_rss = pRVar1->c2n[pRVar1->size_per * already_have_it + 2];
            if ((node != cell_node && node != ref_private_macro_code_rss) &&
               (uVar3 = ref_cavity_insert_seg(ref_cavity,&cell_node), uVar3 != 0)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x3ab,"ref_cavity_form_insert",(ulong)uVar3,"tri side");
              return uVar3;
            }
            cell_node = pRVar1->c2n[pRVar1->size_per * already_have_it + 2];
            ref_private_macro_code_rss = pRVar1->c2n[pRVar1->size_per * already_have_it];
            if ((node != cell_node && node != ref_private_macro_code_rss) &&
               (uVar3 = ref_cavity_insert_seg(ref_cavity,&cell_node), uVar3 != 0)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x3b1,"ref_cavity_form_insert",(ulong)uVar3,"tri side");
              return uVar3;
            }
            cell_node = pRVar1->c2n[pRVar1->size_per * already_have_it];
            ref_private_macro_code_rss = pRVar1->c2n[pRVar1->size_per * already_have_it + 1];
            if ((node != cell_node && node != ref_private_macro_code_rss) &&
               (uVar3 = ref_cavity_insert_seg(ref_cavity,&cell_node), uVar3 != 0)) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x3b7,"ref_cavity_form_insert",(ulong)uVar3,"tri side");
              return uVar3;
            }
          }
          face_node = pRVar1->ref_adj->item[face_node].next;
          if (face_node == -1) {
            local_c8 = -1;
          }
          else {
            local_c8 = pRVar1->ref_adj->item[face_node].ref;
          }
          already_have_it = local_c8;
        }
        pRVar1 = ref_grid->cell[8];
        if ((site < 0) || (pRVar1->ref_adj->nnode <= site)) {
          local_cc = -1;
        }
        else {
          local_cc = pRVar1->ref_adj->first[site];
        }
        face_node = local_cc;
        if (local_cc == -1) {
          local_d0 = -1;
        }
        else {
          local_d0 = pRVar1->ref_adj->item[local_cc].ref;
        }
        already_have_it = local_d0;
        while (face_node != -1) {
          bVar4 = false;
          for (ref_private_macro_code_rss_7 = 0; ref_private_macro_code_rss_7 < pRVar1->node_per;
              ref_private_macro_code_rss_7 = ref_private_macro_code_rss_7 + 1) {
            bVar2 = !bVar4;
            bVar4 = true;
            if (bVar2) {
              bVar4 = protect ==
                      pRVar1->c2n[ref_private_macro_code_rss_7 + pRVar1->size_per * already_have_it]
              ;
            }
          }
          if (!bVar4) {
            uVar3 = ref_list_contains(ref_cavity->tet_list,already_have_it,face_nodes + 2);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x3c6,"ref_cavity_form_insert",(ulong)uVar3,"have tet?");
              return uVar3;
            }
            if (face_nodes[2] != 0) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x3c7,"ref_cavity_form_insert","added tet twice?");
              return 1;
            }
            uVar3 = ref_list_push(ref_cavity->tet_list,already_have_it);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x3c8,"ref_cavity_form_insert",(ulong)uVar3,"save tet");
              return uVar3;
            }
            uVar3 = ref_cell_all_local(pRVar1,ref_node_00,already_have_it,face_nodes + 1);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x3c9,"ref_cavity_form_insert",(ulong)uVar3,"local cell");
              return uVar3;
            }
            if (face_nodes[1] == 0) {
              ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
              return 0;
            }
            for (cell = 0; cell < pRVar1->face_per; cell = cell + 1) {
              for (has_node = 0; has_node < 3; has_node = has_node + 1) {
                seg_nodes[(long)has_node + 1] =
                     pRVar1->c2n
                     [pRVar1->f2n[has_node + cell * 4] + pRVar1->size_per * already_have_it];
              }
              bVar4 = true;
              if ((node != seg_nodes[1]) && (bVar4 = true, node != seg_nodes[2])) {
                bVar4 = node == face_nodes[0];
              }
              if ((!bVar4) && (uVar3 = ref_cavity_insert_face(ref_cavity,seg_nodes + 1), uVar3 != 0)
                 ) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x3d6,"ref_cavity_form_insert",(ulong)uVar3,"tet side");
                return uVar3;
              }
            }
          }
          face_node = pRVar1->ref_adj->item[face_node].next;
          if (face_node == -1) {
            local_d8 = -1;
          }
          else {
            local_d8 = pRVar1->ref_adj->item[face_node].ref;
          }
          already_have_it = local_d8;
        }
        if (ref_cavity->debug != 0) {
          printf("insert form state %d\n",(ulong)ref_cavity->state);
        }
        ref_cavity_local._4_4_ = ref_cavity_verify_face_manifold(ref_cavity);
        if (ref_cavity_local._4_4_ == 0) {
          if (ref_cavity->debug != 0) {
            printf("insert face manifold state %d\n",(ulong)ref_cavity->state);
          }
          ref_cavity_local._4_4_ = ref_cavity_verify_seg_manifold(ref_cavity);
          if (ref_cavity_local._4_4_ == 0) {
            if (ref_cavity->debug != 0) {
              printf("insert seg manifold state %d\n",(ulong)ref_cavity->state);
            }
            ref_cavity_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x3e1,"ref_cavity_form_insert",(ulong)ref_cavity_local._4_4_,"ball seg manifold"
                  );
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x3dd,"ref_cavity_form_insert",(ulong)ref_cavity_local._4_4_,"ball face manifold");
        }
      }
      else {
        ref_cavity->state = REF_CAVITY_MANIFOLD_CONSTRAINED;
        ref_cavity_local._4_4_ = 0;
      }
    }
    else {
      ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
      ref_cavity_local._4_4_ = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x381,
           "ref_cavity_form_insert",(ulong)ref_cavity_local._4_4_,"init form empty");
  }
  return ref_cavity_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_form_insert(REF_CAVITY ref_cavity,
                                          REF_GRID ref_grid, REF_INT node,
                                          REF_INT site, REF_INT protect,
                                          REF_INT faceid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell_face, face_node, cell;
  REF_BOOL has_node;
  REF_BOOL already_have_it, all_local;
  REF_INT face_nodes[3], seg_nodes[3];

  RSS(ref_cavity_form_empty(ref_cavity, ref_grid, node), "init form empty");
  if (!ref_node_owned(ref_node, node) || !ref_node_owned(ref_node, site)) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
    return REF_SUCCESS;
  }

  /* mixed element protections are not mature */
  if (ref_cell_n(ref_grid_pyr(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_pri(ref_grid)) > 0) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_MANIFOLD_CONSTRAINED;
    return REF_SUCCESS;
  }

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_having_node(ref_cell, site, item, cell) {
    REF_INT cell_node;
    REF_BOOL protected_cell = REF_FALSE;
    each_ref_cell_cell_node(ref_cell, cell_node) {
      protected_cell = protected_cell ||
                       (protect == ref_cell_c2n(ref_cell, cell_node, cell));
    }
    if (protected_cell) continue;
    /* only insert tri with faceid if not empty */
    if (REF_EMPTY != faceid &&
        faceid != ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell))
      continue;
    RSS(ref_list_contains(ref_cavity_tri_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    RAS(!already_have_it, "added tri twice?");
    RSS(ref_list_push(ref_cavity_tri_list(ref_cavity), cell), "save tri");
    RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local), "local cell");
    if (!all_local) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
      return REF_SUCCESS;
    }

    seg_nodes[2] = ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell);
    seg_nodes[0] = ref_cell_c2n(ref_cell, 1, cell);
    seg_nodes[1] = ref_cell_c2n(ref_cell, 2, cell);
    has_node = (node == seg_nodes[0] || node == seg_nodes[1]);
    if (!has_node) {
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    }
    seg_nodes[0] = ref_cell_c2n(ref_cell, 2, cell);
    seg_nodes[1] = ref_cell_c2n(ref_cell, 0, cell);
    has_node = (node == seg_nodes[0] || node == seg_nodes[1]);
    if (!has_node) {
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    }
    seg_nodes[0] = ref_cell_c2n(ref_cell, 0, cell);
    seg_nodes[1] = ref_cell_c2n(ref_cell, 1, cell);
    has_node = (node == seg_nodes[0] || node == seg_nodes[1]);
    if (!has_node) {
      RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    }
  }

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_having_node(ref_cell, site, item, cell) {
    REF_INT cell_node;
    REF_BOOL protected_cell = REF_FALSE;
    each_ref_cell_cell_node(ref_cell, cell_node) {
      protected_cell = protected_cell ||
                       (protect == ref_cell_c2n(ref_cell, cell_node, cell));
    }
    if (protected_cell) continue;
    RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    RAS(!already_have_it, "added tet twice?");
    RSS(ref_list_push(ref_cavity_tet_list(ref_cavity), cell), "save tet");
    RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local), "local cell");
    if (!all_local) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
      return REF_SUCCESS;
    }
    each_ref_cell_cell_face(ref_cell, cell_face) {
      each_ref_cavity_face_node(ref_cavity, face_node) {
        face_nodes[face_node] =
            ref_cell_f2n(ref_cell, face_node, cell_face, cell);
      }
      has_node = (node == face_nodes[0] || node == face_nodes[1] ||
                  node == face_nodes[2]);
      if (!has_node) {
        RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet side");
      }
    }
  }

  if (ref_cavity_debug(ref_cavity))
    printf("insert form state %d\n", (int)ref_cavity_state(ref_cavity));
  RSS(ref_cavity_verify_face_manifold(ref_cavity), "ball face manifold");
  if (ref_cavity_debug(ref_cavity))
    printf("insert face manifold state %d\n",
           (int)ref_cavity_state(ref_cavity));
  RSS(ref_cavity_verify_seg_manifold(ref_cavity), "ball seg manifold");
  if (ref_cavity_debug(ref_cavity))
    printf("insert seg manifold state %d\n", (int)ref_cavity_state(ref_cavity));

  return REF_SUCCESS;
}